

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinter.cpp
# Opt level: O3

void my_do_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  ostream *poVar2;
  Am_Object inter;
  Am_Value value;
  Am_Object local_20;
  Am_Value local_18;
  
  Am_Object::Get_Object((ushort)&local_20,(ulong)cmd);
  local_18.type = 0;
  local_18.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar1 = (Am_Value *)Am_Object::Get((ushort)cmd,0x169);
  Am_Value::operator=(&local_18,pAVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n+-+-+- Command ",0x10)
  ;
  poVar2 = (ostream *)operator<<((ostream *)&std::cout,cmd);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," for inter ",0xb);
  poVar2 = (ostream *)operator<<(poVar2,&local_20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," value = ",9);
  poVar2 = (ostream *)operator<<(poVar2,&local_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," type ",6);
  Am_Print_Type((ostream *)&std::cout,local_18.type);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  std::ostream::flush();
  Am_Value::~Am_Value(&local_18);
  Am_Object::~Am_Object(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, my_do, (Am_Object cmd))
{
  Am_Object inter = cmd.Get_Owner();
  Am_Value value;
  value = cmd.Peek(Am_VALUE);
  cout << "\n+-+-+- Command " << cmd << " for inter " << inter
       << " value = " << value << " type ";
  Am_Print_Type(cout, value.type);
  cout << endl << flush;
}